

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder_internal.h
# Opt level: O0

bool __thiscall
basist::bitwise_decoder::read_huffman_table(bitwise_decoder *this,huffman_decoding_table *ct)

{
  uchar uVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  uchar *puVar6;
  huffman_decoding_table *in_RSI;
  uint8_t prev;
  uint32_t l;
  int c;
  uint32_t cur;
  uint8_vec code_sizes;
  huffman_decoding_table code_length_table;
  uint32_t i;
  uint32_t num_codelength_codes;
  uint8_t code_length_code_sizes [21];
  uint32_t total_used_syms;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  huffman_decoding_table *in_stack_fffffffffffffef0;
  uint32_t num_bits;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  undefined8 in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  uchar in_stack_ffffffffffffff0f;
  huffman_decoding_table *in_stack_ffffffffffffff10;
  int local_9c;
  uchar local_98;
  uint local_94;
  huffman_decoding_table local_70;
  uint local_40;
  uint local_3c;
  undefined1 local_38 [28];
  uint32_t local_1c;
  huffman_decoding_table *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  huffman_decoding_table::clear(in_stack_fffffffffffffef0);
  local_1c = get_bits((bitwise_decoder *)
                      CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                      (uint32_t)((ulong)in_stack_fffffffffffffef0 >> 0x20));
  if (local_1c == 0) {
    local_1 = 1;
  }
  else if (local_1c < 0x4001) {
    basisu::clear_obj<unsigned_char[21]>((uchar (*) [21])0x1cb8e5);
    local_3c = get_bits((bitwise_decoder *)
                        CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                        (uint32_t)((ulong)in_stack_fffffffffffffef0 >> 0x20));
    if ((local_3c == 0) || (0x15 < local_3c)) {
      local_1 = 0;
    }
    else {
      for (local_40 = 0; local_40 < local_3c; local_40 = local_40 + 1) {
        uVar3 = get_bits((bitwise_decoder *)
                         CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         (uint32_t)((ulong)in_stack_fffffffffffffef0 >> 0x20));
        local_38[(byte)basisu::g_huffman_sorted_codelength_codes[local_40]] = (char)uVar3;
      }
      huffman_decoding_table::huffman_decoding_table(in_stack_ffffffffffffff10);
      uVar4 = huffman_decoding_table::init(&local_70,(EVP_PKEY_CTX *)0x15);
      if ((uVar4 & 1) == 0) {
        local_1 = 0;
      }
      else {
        bVar2 = huffman_decoding_table::is_valid((huffman_decoding_table *)0x1cb9f2);
        if (bVar2) {
          basisu::vector<unsigned_char>::vector
                    (&in_stack_fffffffffffffef0->m_code_sizes,
                     CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
          local_94 = 0;
          while (local_94 < local_1c) {
            uVar3 = decode_huffman((bitwise_decoder *)in_stack_ffffffffffffff10,
                                   (huffman_decoding_table *)
                                   CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                                   (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
            if ((int)uVar3 < 0x11) {
              local_98 = (uchar)uVar3;
              local_94 = local_94 + 1;
              puVar6 = basisu::vector<unsigned_char>::operator[]
                                 (&in_stack_fffffffffffffef0->m_code_sizes,
                                  CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
              *puVar6 = local_98;
            }
            else {
              num_bits = (uint32_t)((ulong)in_stack_fffffffffffffef0 >> 0x20);
              if (uVar3 == 0x11) {
                uVar3 = get_bits((bitwise_decoder *)
                                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                 num_bits);
                local_94 = uVar3 + 3 + local_94;
              }
              else if (uVar3 == 0x12) {
                uVar3 = get_bits((bitwise_decoder *)
                                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                 num_bits);
                local_94 = uVar3 + 0xb + local_94;
              }
              else {
                if (local_94 == 0) {
                  local_1 = 0;
                  goto LAB_001cbd23;
                }
                if (uVar3 == 0x13) {
                  uVar3 = get_bits((bitwise_decoder *)
                                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                   num_bits);
                  local_9c = uVar3 + 3;
                }
                else {
                  uVar3 = get_bits((bitwise_decoder *)
                                   CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                   num_bits);
                  local_9c = uVar3 + 7;
                }
                puVar6 = basisu::vector<unsigned_char>::operator[]
                                   (&in_stack_fffffffffffffef0->m_code_sizes,
                                    CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
                uVar1 = *puVar6;
                if (uVar1 == '\0') {
                  local_1 = 0;
                  goto LAB_001cbd23;
                }
                do {
                  if (local_1c <= local_94) {
                    local_1 = 0;
                    goto LAB_001cbd23;
                  }
                  local_94 = local_94 + 1;
                  in_stack_ffffffffffffff0f = uVar1;
                  in_stack_ffffffffffffff10 =
                       (huffman_decoding_table *)
                       basisu::vector<unsigned_char>::operator[]
                                 (&in_stack_fffffffffffffef0->m_code_sizes,
                                  CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
                  *(uchar *)&(in_stack_ffffffffffffff10->m_code_sizes).m_p =
                       in_stack_ffffffffffffff0f;
                  local_9c = local_9c + -1;
                } while (local_9c != 0);
              }
            }
          }
          if (local_94 == local_1c) {
            uVar3 = local_1c;
            basisu::vector<unsigned_char>::operator[]
                      (&local_18->m_code_sizes,
                       CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
            iVar5 = huffman_decoding_table::init(local_18,(EVP_PKEY_CTX *)(ulong)uVar3);
            local_1 = (byte)iVar5 & 1;
            in_stack_fffffffffffffef0 = local_18;
          }
          else {
            local_1 = 0;
          }
LAB_001cbd23:
          basisu::vector<unsigned_char>::~vector(&in_stack_fffffffffffffef0->m_code_sizes);
        }
        else {
          local_1 = 0;
        }
      }
      huffman_decoding_table::~huffman_decoding_table(in_stack_fffffffffffffef0);
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool read_huffman_table(huffman_decoding_table &ct)
		{
			ct.clear();

			const uint32_t total_used_syms = get_bits(basisu::cHuffmanMaxSymsLog2);

			if (!total_used_syms)
				return true;
			if (total_used_syms > basisu::cHuffmanMaxSyms)
				return false;

			uint8_t code_length_code_sizes[basisu::cHuffmanTotalCodelengthCodes];
			basisu::clear_obj(code_length_code_sizes);

			const uint32_t num_codelength_codes = get_bits(5);
			if ((num_codelength_codes < 1) || (num_codelength_codes > basisu::cHuffmanTotalCodelengthCodes))
				return false;

			for (uint32_t i = 0; i < num_codelength_codes; i++)
				code_length_code_sizes[basisu::g_huffman_sorted_codelength_codes[i]] = static_cast<uint8_t>(get_bits(3));

			huffman_decoding_table code_length_table;
			if (!code_length_table.init(basisu::cHuffmanTotalCodelengthCodes, code_length_code_sizes))
				return false;

			if (!code_length_table.is_valid())
				return false;

			basisu::uint8_vec code_sizes(total_used_syms);

			uint32_t cur = 0;
			while (cur < total_used_syms)
			{
				int c = decode_huffman(code_length_table);

				if (c <= 16)
					code_sizes[cur++] = static_cast<uint8_t>(c);
				else if (c == basisu::cHuffmanSmallZeroRunCode)
					cur += get_bits(basisu::cHuffmanSmallZeroRunExtraBits) + basisu::cHuffmanSmallZeroRunSizeMin;
				else if (c == basisu::cHuffmanBigZeroRunCode)
					cur += get_bits(basisu::cHuffmanBigZeroRunExtraBits) + basisu::cHuffmanBigZeroRunSizeMin;
				else
				{
					if (!cur)
						return false;

					uint32_t l;
					if (c == basisu::cHuffmanSmallRepeatCode)
						l = get_bits(basisu::cHuffmanSmallRepeatExtraBits) + basisu::cHuffmanSmallRepeatSizeMin;
					else
						l = get_bits(basisu::cHuffmanBigRepeatExtraBits) + basisu::cHuffmanBigRepeatSizeMin;

					const uint8_t prev = code_sizes[cur - 1];
					if (prev == 0)
						return false;
					do
					{
						if (cur >= total_used_syms)
							return false;
						code_sizes[cur++] = prev;
					} while (--l > 0);
				}
			}

			if (cur != total_used_syms)
				return false;

			return ct.init(total_used_syms, &code_sizes[0]);
		}